

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int build_pathname_utf16be(uchar *p,size_t max,size_t *len,file_info *file)

{
  int iVar1;
  size_t *in_RCX;
  long *in_RDX;
  uchar *in_RSI;
  long in_RDI;
  
  if ((in_RCX[1] != 0) && (*(long *)(in_RCX[1] + 200) != 0)) {
    iVar1 = build_pathname_utf16be(in_RSI,(size_t)in_RDX,in_RCX,(file_info *)0x1383e0);
    if (iVar1 != 0) {
      return -1;
    }
    *(undefined1 *)(in_RDI + *in_RDX) = 0;
    *(undefined1 *)(in_RDI + 1 + *in_RDX) = 0x2f;
    *in_RDX = *in_RDX + 2;
  }
  if (in_RCX[0x19] == 0) {
    if (in_RSI < (uchar *)(*in_RDX + 2U)) {
      return -1;
    }
    *(undefined1 *)(in_RDI + *in_RDX) = 0;
    *(undefined1 *)(in_RDI + 1 + *in_RDX) = 0x2e;
    *in_RDX = *in_RDX + 2;
  }
  else {
    if (in_RSI < (uchar *)(*in_RDX + in_RCX[0x19])) {
      return -1;
    }
    memcpy((void *)(in_RDI + *in_RDX),(void *)in_RCX[0x18],in_RCX[0x19]);
    *in_RDX = in_RCX[0x19] + *in_RDX;
  }
  return 0;
}

Assistant:

static int
build_pathname_utf16be(unsigned char *p, size_t max, size_t *len,
    struct file_info *file)
{
	if (file->parent != NULL && file->parent->utf16be_bytes > 0) {
		if (build_pathname_utf16be(p, max, len, file->parent) != 0)
			return (-1);
		p[*len] = 0;
		p[*len + 1] = '/';
		*len += 2;
	}
	if (file->utf16be_bytes == 0) {
		if (*len + 2 > max)
			return (-1);/* Path is too long! */
		p[*len] = 0;
		p[*len + 1] = '.';
		*len += 2;
	} else {
		if (*len + file->utf16be_bytes > max)
			return (-1);/* Path is too long! */
		memcpy(p + *len, file->utf16be_name, file->utf16be_bytes);
		*len += file->utf16be_bytes;
	}
	return (0);
}